

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O2

Value __thiscall xmrig::OclThread::toJSON(OclThread *this,Document *doc)

{
  Ch **this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  bool bVar2;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar4;
  Value VVar5;
  Value threads;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this->m_datasetHost = false;
  this->m_gcnAsm = false;
  *(undefined6 *)&this->field_0x2 = 0;
  (this->m_fields).super__Base_bitset<1UL>._M_w = 0;
  *(undefined2 *)((long)&(this->m_fields).super__Base_bitset<1UL>._M_w + 6) = 3;
  local_40.s = "index";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_40,*(uint *)((long)&(doc->stack_).ownAllocator_ + 4),allocator);
  local_50.s = "intensity";
  local_50.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_50,*(uint *)&(doc->stack_).stack_,allocator);
  local_60.s = "worksize";
  local_60.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,&local_60,*(uint *)&(doc->stack_).stackEnd_,allocator);
  this_00 = &(doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ).data_.s.str;
  bVar2 = std::bitset<2UL>::test((bitset<2UL> *)this_00,0);
  if (bVar2) {
    threads.data_.n = (Number)0x0;
    threads.data_.s.str = (Ch *)0x4000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    Reserve(&threads,2,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>(&threads,*(uint *)&(doc->stack_).stackTop_,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>(&threads,*(uint *)((long)&(doc->stack_).stack_ + 4),allocator);
    local_70.s = "strided_index";
    local_70.length = 0xd;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_70,&threads,allocator);
  }
  threads.data_.n = (Number)0x0;
  threads.data_.s.str = (Ch *)0x4000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  Reserve(&threads,(SizeType)((ulong)((long)doc->ownAllocator_ - (long)doc->allocator_) >> 3),
          allocator);
  pMVar1 = doc->ownAllocator_;
  for (pMVar4 = doc->allocator_; pMVar4 != pMVar1;
      pMVar4 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)&pMVar4->chunk_capacity_) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<long>(&threads,(long)pMVar4->chunkHead_,allocator);
  }
  local_80.s = "threads";
  local_80.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_80,&threads,allocator);
  bVar2 = std::bitset<2UL>::test((bitset<2UL> *)this_00,1);
  uVar3 = extraout_RDX;
  if (!bVar2) {
    local_90.s = "unroll";
    local_90.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_90,*(uint *)((long)&(doc->stack_).stackTop_ + 4),allocator);
    uVar3 = extraout_RDX_00;
  }
  VVar5.data_.s.str = (Ch *)uVar3;
  VVar5.data_.n = (Number)this;
  return (Value)VVar5.data_;
}

Assistant:

rapidjson::Value xmrig::OclThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);

    out.AddMember(StringRef(kIndex),        index(), allocator);
    out.AddMember(StringRef(kIntensity),    intensity(), allocator);
    out.AddMember(StringRef(kWorksize),     worksize(), allocator);

    if (m_fields.test(STRIDED_INDEX_FIELD)) {
        Value si(kArrayType);
        si.Reserve(2, allocator);
        si.PushBack(stridedIndex(), allocator);
        si.PushBack(memChunk(), allocator);
        out.AddMember(StringRef(kStridedIndex), si, allocator);
    }

    Value threads(kArrayType);
    threads.Reserve(m_threads.size(), allocator);

    for (auto thread : m_threads) {
        threads.PushBack(thread, allocator);
    }

    out.AddMember(StringRef(kThreads), threads, allocator);

    if (m_fields.test(RANDOMX_FIELDS)) {
    }
    else {
        out.AddMember(StringRef(kUnroll), unrollFactor(), allocator);
    }

    return out;
}